

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  ImVector<ImGuiTabItem> *in_RDI;
  ImVector<ImGuiTabItem> *this_00;
  
  this_00 = in_RDI;
  ImVector<ImGuiTabItem>::ImVector(in_RDI);
  ImRect::ImRect((ImRect *)this_00);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[7].Data);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 8));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x1a793d);
  memset(in_RDI,0,0x98);
  *(undefined4 *)&in_RDI[2].Data = 0xffffffff;
  in_RDI[2].Capacity = -1;
  *(undefined2 *)&in_RDI[7].Size = 0xffff;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    memset(this, 0, sizeof(*this));
    CurrFrameVisible = PrevFrameVisible = -1;
    LastTabItemIdx = -1;
}